

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::ReleaseDecommittedSegment
          (HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this,
          SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  size_t *psVar1;
  size_t sVar2;
  PageMemoryData *pPVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  bVar5 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ::ValidThreadAccess(&this->
                               super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                             );
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa20,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  sVar2 = segment->segmentPageCount;
  psVar1 = &(this->
            super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ).reservedBytes;
  *psVar1 = *psVar1 + sVar2 * -0x1000;
  psVar1 = &(this->
            super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ).numberOfSegments;
  *psVar1 = *psVar1 - 1;
  pPVar3 = (this->
           super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           ).memoryData;
  if (pPVar3 != (PageMemoryData *)0x0) {
    pPVar3->releaseSegmentCount = pPVar3->releaseSegmentCount + 1;
    pPVar3->releaseSegmentBytes = pPVar3->releaseSegmentBytes + sVar2 * 0x1000;
  }
  DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  RemoveElement<Memory::NoThrowHeapAllocator>
            (&(this->
              super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              ).largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment);
  return;
}

Assistant:

void
HeapPageAllocator<T>::ReleaseDecommittedSegment(__in SegmentBase<T>* segment)
{
    ASSERT_THREAD();

    this->LogFreeDecommittedSegment(segment);
    this->largeSegments.RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
}